

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

char * xmlParserGetDirectory(char *filename)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  char dir [1024];
  
  if (filename == (char *)0x0) {
    return (char *)0x0;
  }
  pcVar3 = dir;
  strncpy(dir,filename,0x3ff);
  dir[0x3ff] = '\0';
  sVar2 = strlen(dir);
  while( true ) {
    cVar1 = dir[sVar2];
    if (dir + sVar2 <= dir) break;
    if (cVar1 == '/') goto LAB_00157bd8;
    sVar2 = sVar2 - 1;
  }
  if (cVar1 == '/') {
LAB_00157bd8:
    sVar4 = 1;
    if (sVar2 != 0) {
      sVar4 = sVar2;
    }
    dir[sVar4] = '\0';
  }
  else {
    pcVar3 = ".";
  }
  pcVar3 = (*xmlMemStrdup)(pcVar3);
  return pcVar3;
}

Assistant:

char *
xmlParserGetDirectory(const char *filename) {
    char *ret = NULL;
    char dir[1024];
    char *cur;

    if (filename == NULL) return(NULL);

#if defined(_WIN32)
#   define IS_XMLPGD_SEP(ch) ((ch=='/')||(ch=='\\'))
#else
#   define IS_XMLPGD_SEP(ch) (ch=='/')
#endif

    strncpy(dir, filename, 1023);
    dir[1023] = 0;
    cur = &dir[strlen(dir)];
    while (cur > dir) {
         if (IS_XMLPGD_SEP(*cur)) break;
	 cur --;
    }
    if (IS_XMLPGD_SEP(*cur)) {
        if (cur == dir) dir[1] = 0;
	else *cur = 0;
	ret = xmlMemStrdup(dir);
    } else {
        ret = xmlMemStrdup(".");
    }
    return(ret);
#undef IS_XMLPGD_SEP
}